

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O2

Value * duckdb::DefaultValue(Value *__return_storage_ptr__,ColumnDefinition *def)

{
  bool bVar1;
  ParsedExpression *pPVar2;
  string *this;
  LogicalType LStack_68;
  string local_50;
  string local_30;
  
  bVar1 = ColumnDefinition::Generated(def);
  if (bVar1) {
    pPVar2 = ColumnDefinition::GeneratedExpression(def);
    (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_30,pPVar2);
    Value::Value(__return_storage_ptr__,&local_30);
    this = &local_30;
  }
  else {
    bVar1 = ColumnDefinition::HasDefaultValue(def);
    if (!bVar1) {
      LogicalType::LogicalType(&LStack_68,SQLNULL);
      Value::Value(__return_storage_ptr__,&LStack_68);
      LogicalType::~LogicalType(&LStack_68);
      return __return_storage_ptr__;
    }
    pPVar2 = ColumnDefinition::DefaultValue(def);
    (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar2);
    Value::Value(__return_storage_ptr__,&local_50);
    this = &local_50;
  }
  ::std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

static Value DefaultValue(const ColumnDefinition &def) {
	if (def.Generated()) {
		return Value(def.GeneratedExpression().ToString());
	}
	if (!def.HasDefaultValue()) {
		return Value();
	}
	auto &value = def.DefaultValue();
	return Value(value.ToString());
}